

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall cmFindBase::FillUserGuessPath(cmFindBase *this)

{
  mapped_type *this_00;
  pointer path;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::Guess);
  for (path = (this->super_cmFindCommon).UserGuessArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      path != (this->super_cmFindCommon).UserGuessArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
    cmSearchPath::AddUserPath(this_00,path);
  }
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillUserGuessPath()
{
  cmSearchPath &paths = this->LabeledPaths[PathLabel::Guess];

  for(std::vector<std::string>::const_iterator p = this->UserGuessArgs.begin();
      p != this->UserGuessArgs.end(); ++p)
    {
    paths.AddUserPath(*p);
    }
  paths.AddSuffixes(this->SearchPathSuffixes);
}